

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trinload.cpp
# Opt level: O0

TrackData * __thiscall
TrinLoadDisk::load(TrackData *__return_storage_ptr__,TrinLoadDisk *this,CylHead *cylhead,
                  bool param_2)

{
  pointer *this_00;
  pointer this_01;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c8;
  const_iterator local_c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b8;
  const_iterator local_b0;
  Format local_a8;
  undefined1 local_60 [8];
  Track track;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  bool param_2_local;
  CylHead *cylhead_local;
  TrinLoadDisk *this_local;
  
  this_01 = std::unique_ptr<Trinity,_std::default_delete<Trinity>_>::operator->(&this->m_trinity);
  Trinity::read_track((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,this_01,cylhead->cyl,cylhead->head)
  ;
  Track::Track((Track *)local_60,0);
  Format::Format(&local_a8,MGT);
  Track::format((Track *)local_60,cylhead,&local_a8);
  this_00 = &track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_b8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_b0,&local_b8);
  local_c8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_c0,&local_c8);
  Track::populate((Track *)local_60,local_b0,local_c0);
  TrackData::TrackData(__return_storage_ptr__,cylhead,(Track *)local_60);
  Track::~Track((Track *)local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

TrackData load(const CylHead& cylhead, bool /*first_read*/) override
    {
        auto data = m_trinity->read_track(cylhead.cyl, cylhead.head);

        Track track;
        track.format(cylhead, RegularFormat::MGT);
        track.populate(data.begin(), data.end());
        return TrackData(cylhead, std::move(track));
    }